

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined8 uVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar17) [32];
  long lVar18;
  byte bVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar30 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar59;
  float fVar60;
  undefined4 uVar61;
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_25ec;
  int local_25c4;
  ulong local_25c0;
  ulong *local_25b8;
  RayQueryContext *local_25b0;
  long local_25a8;
  long local_25a0;
  Geometry *local_2598;
  Scene *local_2590;
  RTCFilterFunctionNArguments local_2588;
  float local_2558;
  undefined4 local_2554;
  undefined4 local_2550;
  undefined4 local_254c;
  undefined4 local_2548;
  undefined4 local_2544;
  uint local_2540;
  uint local_253c;
  uint local_2538;
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  byte local_24c7;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25b8 = local_2368;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar52 = (ray->super_RayK<1>).tfar;
    auVar56 = ZEXT464((uint)fVar52);
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl((undefined1  [16])aVar2,auVar26);
    auVar28._8_4_ = 0x219392ef;
    auVar28._0_8_ = 0x219392ef219392ef;
    auVar28._12_4_ = 0x219392ef;
    local_2370[0] = 0;
    uVar22 = vcmpps_avx512vl(auVar26,auVar28,1);
    bVar6 = (bool)((byte)uVar22 & 1);
    auVar27._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.x;
    bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
    auVar27._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.y;
    bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
    auVar27._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.z;
    bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
    auVar27._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * aVar2.field_3.a;
    auVar28 = vrcp14ps_avx512vl(auVar27);
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    auVar29 = vfnmadd213ps_avx512vl(auVar27,auVar28,auVar29);
    auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar52));
    auVar28 = vfmadd132ps_fma(auVar29,auVar28,auVar28);
    auVar43 = vbroadcastss_avx512vl(auVar28);
    auVar67 = ZEXT3264(auVar43);
    auVar29 = vmovshdup_avx(auVar28);
    auVar43 = vbroadcastsd_avx512vl(auVar29);
    auVar68 = ZEXT3264(auVar43);
    auVar27 = vshufpd_avx(auVar28,auVar28,1);
    auVar47._8_4_ = 2;
    auVar47._0_8_ = 0x200000002;
    auVar47._12_4_ = 2;
    auVar47._16_4_ = 2;
    auVar47._20_4_ = 2;
    auVar47._24_4_ = 2;
    auVar47._28_4_ = 2;
    auVar43 = vpermps_avx512vl(auVar47,ZEXT1632(auVar28));
    auVar69 = ZEXT3264(auVar43);
    fVar52 = auVar28._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar50._4_4_ = fVar52;
    auVar50._0_4_ = fVar52;
    auVar50._8_4_ = fVar52;
    auVar50._12_4_ = fVar52;
    auVar50._16_4_ = fVar52;
    auVar50._20_4_ = fVar52;
    auVar50._24_4_ = fVar52;
    auVar50._28_4_ = fVar52;
    auVar43 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar70 = ZEXT3264(auVar43);
    auVar45 = ZEXT1632(CONCAT412(auVar28._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar28._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar28._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar52))
                                ));
    auVar44 = vpermps_avx512vl(auVar43,auVar45);
    auVar43 = vpermps_avx2(auVar47,auVar45);
    local_25c0 = (ulong)(auVar28._0_4_ < 0.0) << 5;
    uVar22 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x40;
    uVar24 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
    uVar23 = local_25c0 ^ 0x20;
    auVar45 = vbroadcastss_avx512vl(auVar30);
    auVar71 = ZEXT3264(auVar45);
    auVar46._8_4_ = 0x80000000;
    auVar46._0_8_ = 0x8000000080000000;
    auVar46._12_4_ = 0x80000000;
    auVar46._16_4_ = 0x80000000;
    auVar46._20_4_ = 0x80000000;
    auVar46._24_4_ = 0x80000000;
    auVar46._28_4_ = 0x80000000;
    uVar61 = auVar26._0_4_;
    auVar55 = ZEXT3264(CONCAT428(uVar61,CONCAT424(uVar61,CONCAT420(uVar61,CONCAT416(uVar61,CONCAT412
                                                  (uVar61,CONCAT48(uVar61,CONCAT44(uVar61,uVar61))))
                                                  ))));
    auVar45 = vxorps_avx512vl(auVar50,auVar46);
    auVar72 = ZEXT3264(auVar45);
    auVar44 = vxorps_avx512vl(auVar44,auVar46);
    auVar73 = ZEXT3264(auVar44);
    auVar43 = vxorps_avx512vl(auVar43,auVar46);
    auVar74 = ZEXT3264(auVar43);
    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar75 = ZEXT3264(auVar43);
    auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar76 = ZEXT3264(auVar43);
    auVar30 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar77 = ZEXT1664(auVar30);
    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar78 = ZEXT3264(auVar43);
    local_25b0 = context;
    do {
      pfVar1 = (float *)(local_25b8 + -1);
      local_25b8 = local_25b8 + -2;
      if (*pfVar1 <= auVar56._0_4_) {
        uVar20 = *local_25b8;
        while ((uVar20 & 8) == 0) {
          pauVar17 = (undefined1 (*) [32])(uVar20 & 0xfffffffffffffff0);
          uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar57._4_4_ = uVar61;
          auVar57._0_4_ = uVar61;
          auVar57._8_4_ = uVar61;
          auVar57._12_4_ = uVar61;
          auVar57._16_4_ = uVar61;
          auVar57._20_4_ = uVar61;
          auVar57._24_4_ = uVar61;
          auVar57._28_4_ = uVar61;
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + local_25c0),auVar57,
                                    *(undefined1 (*) [32])(pauVar17[2] + local_25c0));
          auVar43 = vfmadd213ps_avx512vl(ZEXT1632(auVar30),auVar67._0_32_,auVar72._0_32_);
          auVar44 = vmaxps_avx512vl(auVar71._0_32_,auVar43);
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + uVar22),auVar57,
                                    *(undefined1 (*) [32])(pauVar17[2] + uVar22));
          auVar26 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + uVar24),auVar57,
                                    *(undefined1 (*) [32])(pauVar17[2] + uVar24));
          auVar43 = vfmadd213ps_avx512vl(ZEXT1632(auVar30),auVar68._0_32_,auVar73._0_32_);
          auVar45 = vfmadd213ps_avx512vl(ZEXT1632(auVar26),auVar69._0_32_,auVar74._0_32_);
          auVar43 = vmaxps_avx(auVar43,auVar45);
          auVar43 = vmaxps_avx(auVar44,auVar43);
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + uVar23),auVar57,
                                    *(undefined1 (*) [32])(pauVar17[2] + uVar23));
          auVar26 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + (uVar22 ^ 0x20)),auVar57,
                                    *(undefined1 (*) [32])(pauVar17[2] + (uVar22 ^ 0x20)));
          auVar45 = vfmadd213ps_avx512vl(ZEXT1632(auVar30),auVar67._0_32_,auVar72._0_32_);
          auVar44 = vfmadd213ps_avx512vl(ZEXT1632(auVar26),auVar68._0_32_,auVar73._0_32_);
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + (uVar24 ^ 0x20)),auVar57,
                                    *(undefined1 (*) [32])(pauVar17[2] + (uVar24 ^ 0x20)));
          auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar30),auVar69._0_32_,auVar74._0_32_);
          auVar44 = vminps_avx(auVar44,auVar46);
          auVar45 = vminps_avx(auVar55._0_32_,auVar45);
          auVar44 = vminps_avx(auVar45,auVar44);
          uVar25 = vcmpps_avx512vl(auVar43,auVar44,2);
          if (((uint)uVar20 & 7) == 6) {
            uVar20 = vcmpps_avx512vl(auVar57,pauVar17[0xe],0xd);
            uVar10 = vcmpps_avx512vl(auVar57,pauVar17[0xf],1);
            uVar25 = uVar25 & uVar20 & uVar10;
          }
          bVar16 = (byte)uVar25;
          if (bVar16 == 0) {
            auVar30 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar56 = ZEXT1664(auVar30);
            goto LAB_01f1e1dd;
          }
          auVar44 = *pauVar17;
          auVar45 = pauVar17[1];
          auVar46 = vmovdqa64_avx512vl(auVar75._0_32_);
          auVar46 = vpternlogd_avx512vl(auVar46,auVar43,auVar76._0_32_,0xf8);
          auVar47 = vpcompressd_avx512vl(auVar46);
          auVar49._0_4_ =
               (uint)(bVar16 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar46._0_4_;
          bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar49._4_4_ = (uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * auVar46._4_4_;
          bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar49._8_4_ = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * auVar46._8_4_;
          bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar49._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * auVar46._12_4_;
          bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar49._16_4_ = (uint)bVar6 * auVar47._16_4_ | (uint)!bVar6 * auVar46._16_4_;
          bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar49._20_4_ = (uint)bVar6 * auVar47._20_4_ | (uint)!bVar6 * auVar46._20_4_;
          bVar6 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar49._24_4_ = (uint)bVar6 * auVar47._24_4_ | (uint)!bVar6 * auVar46._24_4_;
          bVar6 = SUB81(uVar25 >> 7,0);
          auVar49._28_4_ = (uint)bVar6 * auVar47._28_4_ | (uint)!bVar6 * auVar46._28_4_;
          auVar46 = vpermt2q_avx512vl(auVar44,auVar49,auVar45);
          uVar20 = auVar46._0_8_;
          bVar16 = bVar16 - 1 & bVar16;
          if (bVar16 != 0) {
            auVar46 = vpshufd_avx2(auVar49,0x55);
            vpermt2q_avx512vl(auVar44,auVar46,auVar45);
            auVar47 = vpminsd_avx2(auVar49,auVar46);
            auVar46 = vpmaxsd_avx2(auVar49,auVar46);
            bVar16 = bVar16 - 1 & bVar16;
            if (bVar16 == 0) {
              auVar47 = vpermi2q_avx512vl(auVar47,auVar44,auVar45);
              uVar20 = auVar47._0_8_;
              auVar44 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
              *local_25b8 = auVar44._0_8_;
              auVar43 = vpermd_avx2(auVar46,auVar43);
              *(int *)(local_25b8 + 1) = auVar43._0_4_;
              local_25b8 = local_25b8 + 2;
            }
            else {
              auVar57 = vpshufd_avx2(auVar49,0xaa);
              vpermt2q_avx512vl(auVar44,auVar57,auVar45);
              auVar50 = vpminsd_avx2(auVar47,auVar57);
              auVar47 = vpmaxsd_avx2(auVar47,auVar57);
              auVar57 = vpminsd_avx2(auVar46,auVar47);
              auVar46 = vpmaxsd_avx2(auVar46,auVar47);
              bVar16 = bVar16 - 1 & bVar16;
              if (bVar16 == 0) {
                auVar47 = vpermi2q_avx512vl(auVar50,auVar44,auVar45);
                uVar20 = auVar47._0_8_;
                auVar47 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
                *local_25b8 = auVar47._0_8_;
                auVar46 = vpermd_avx2(auVar46,auVar43);
                *(int *)(local_25b8 + 1) = auVar46._0_4_;
                auVar44 = vpermt2q_avx512vl(auVar44,auVar57,auVar45);
                local_25b8[2] = auVar44._0_8_;
                auVar43 = vpermd_avx2(auVar57,auVar43);
                *(int *)(local_25b8 + 3) = auVar43._0_4_;
                local_25b8 = local_25b8 + 4;
              }
              else {
                auVar47 = vpshufd_avx2(auVar49,0xff);
                vpermt2q_avx512vl(auVar44,auVar47,auVar45);
                auVar51 = vpminsd_avx2(auVar50,auVar47);
                auVar47 = vpmaxsd_avx2(auVar50,auVar47);
                auVar50 = vpminsd_avx2(auVar57,auVar47);
                auVar47 = vpmaxsd_avx2(auVar57,auVar47);
                auVar57 = vpminsd_avx2(auVar46,auVar47);
                auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                bVar16 = bVar16 - 1 & bVar16;
                if (bVar16 == 0) {
                  auVar47 = vpermi2q_avx512vl(auVar51,auVar44,auVar45);
                  uVar20 = auVar47._0_8_;
                  auVar47 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
                  *local_25b8 = auVar47._0_8_;
                  auVar46 = vpermd_avx2(auVar46,auVar43);
                  *(int *)(local_25b8 + 1) = auVar46._0_4_;
                  auVar46 = vpermt2q_avx512vl(auVar44,auVar57,auVar45);
                  local_25b8[2] = auVar46._0_8_;
                  auVar46 = vpermd_avx2(auVar57,auVar43);
                  *(int *)(local_25b8 + 3) = auVar46._0_4_;
                  auVar44 = vpermt2q_avx512vl(auVar44,auVar50,auVar45);
                  local_25b8[4] = auVar44._0_8_;
                  auVar43 = vpermd_avx2(auVar50,auVar43);
                  *(int *)(local_25b8 + 5) = auVar43._0_4_;
                  local_25b8 = local_25b8 + 6;
                }
                else {
                  auVar48 = valignd_avx512vl(auVar49,auVar49,3);
                  auVar47 = vmovdqa64_avx512vl(auVar77._0_32_);
                  auVar49 = vpermt2d_avx512vl(auVar47,auVar78._0_32_,auVar51);
                  auVar47 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar50 = vpermt2d_avx512vl(auVar49,auVar47,auVar50);
                  auVar50 = vpermt2d_avx512vl(auVar50,auVar47,auVar57);
                  auVar47 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar46 = vpermt2d_avx512vl(auVar50,auVar47,auVar46);
                  auVar56 = ZEXT3264(auVar46);
                  bVar19 = bVar16;
                  do {
                    auVar47 = auVar56._0_32_;
                    auVar46 = vpermps_avx512vl(auVar70._0_32_,auVar48);
                    auVar48 = valignd_avx512vl(auVar48,auVar48,1);
                    vpermt2q_avx512vl(auVar44,auVar48,auVar45);
                    bVar19 = bVar19 - 1 & bVar19;
                    uVar11 = vpcmpd_avx512vl(auVar46,auVar47,5);
                    auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                    bVar12 = (byte)uVar11 << 1;
                    auVar47 = valignd_avx512vl(auVar47,auVar47,7);
                    bVar6 = (bool)((byte)uVar11 & 1);
                    auVar51._4_4_ = (uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * auVar46._4_4_;
                    auVar51._0_4_ = auVar46._0_4_;
                    bVar6 = (bool)(bVar12 >> 2 & 1);
                    auVar51._8_4_ = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * auVar46._8_4_;
                    bVar6 = (bool)(bVar12 >> 3 & 1);
                    auVar51._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * auVar46._12_4_;
                    bVar6 = (bool)(bVar12 >> 4 & 1);
                    auVar51._16_4_ = (uint)bVar6 * auVar47._16_4_ | (uint)!bVar6 * auVar46._16_4_;
                    bVar6 = (bool)(bVar12 >> 5 & 1);
                    auVar51._20_4_ = (uint)bVar6 * auVar47._20_4_ | (uint)!bVar6 * auVar46._20_4_;
                    bVar6 = (bool)(bVar12 >> 6 & 1);
                    auVar51._24_4_ = (uint)bVar6 * auVar47._24_4_ | (uint)!bVar6 * auVar46._24_4_;
                    auVar51._28_4_ =
                         (uint)(bVar12 >> 7) * auVar47._28_4_ |
                         (uint)!(bool)(bVar12 >> 7) * auVar46._28_4_;
                    auVar56 = ZEXT3264(auVar51);
                  } while (bVar19 != 0);
                  lVar18 = (ulong)(uint)POPCOUNT((uint)bVar16) + 3;
                  do {
                    auVar46 = vpermi2q_avx512vl(auVar51,auVar44,auVar45);
                    *local_25b8 = auVar46._0_8_;
                    auVar47 = auVar56._0_32_;
                    auVar46 = vpermd_avx2(auVar47,auVar43);
                    *(int *)(local_25b8 + 1) = auVar46._0_4_;
                    auVar51 = valignd_avx512vl(auVar47,auVar47,1);
                    local_25b8 = local_25b8 + 2;
                    auVar56 = ZEXT3264(auVar51);
                    lVar18 = lVar18 + -1;
                  } while (lVar18 != 0);
                  auVar43 = vpermt2q_avx512vl(auVar44,auVar51,auVar45);
                  uVar20 = auVar43._0_8_;
                }
              }
            }
          }
        }
        local_25a0 = (ulong)((uint)uVar20 & 0xf) - 8;
        if (local_25a0 != 0) {
          uVar20 = uVar20 & 0xfffffffffffffff0;
          local_25a8 = 0;
          do {
            lVar18 = local_25a8 * 0x140;
            uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar31._4_4_ = uVar61;
            auVar31._0_4_ = uVar61;
            auVar31._8_4_ = uVar61;
            auVar31._12_4_ = uVar61;
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x90 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + lVar18));
            auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xa0 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x10 + lVar18));
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xb0 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x20 + lVar18));
            auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xc0 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x30 + lVar18));
            auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xd0 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x40 + lVar18));
            auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xe0 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x50 + lVar18));
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xf0 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x60 + lVar18));
            auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x100 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x70 + lVar18));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x110 + lVar18),auVar31,
                                      *(undefined1 (*) [16])(uVar20 + 0x80 + lVar18));
            auVar30 = vsubps_avx(auVar34,auVar30);
            auVar26 = vsubps_avx(auVar35,auVar26);
            auVar29 = vsubps_avx(auVar36,auVar29);
            auVar27 = vsubps_avx(auVar27,auVar34);
            auVar28 = vsubps_avx(auVar28,auVar35);
            auVar40 = vsubps_avx(auVar40,auVar36);
            auVar32._0_4_ = auVar26._0_4_ * auVar40._0_4_;
            auVar32._4_4_ = auVar26._4_4_ * auVar40._4_4_;
            auVar32._8_4_ = auVar26._8_4_ * auVar40._8_4_;
            auVar32._12_4_ = auVar26._12_4_ * auVar40._12_4_;
            local_2488 = vfmsub231ps_fma(auVar32,auVar28,auVar29);
            auVar37._0_4_ = auVar29._0_4_ * auVar27._0_4_;
            auVar37._4_4_ = auVar29._4_4_ * auVar27._4_4_;
            auVar37._8_4_ = auVar29._8_4_ * auVar27._8_4_;
            auVar37._12_4_ = auVar29._12_4_ * auVar27._12_4_;
            local_2478 = vfmsub231ps_fma(auVar37,auVar40,auVar30);
            auVar38._0_4_ = auVar30._0_4_ * auVar28._0_4_;
            auVar38._4_4_ = auVar30._4_4_ * auVar28._4_4_;
            auVar38._8_4_ = auVar30._8_4_ * auVar28._8_4_;
            auVar38._12_4_ = auVar30._12_4_ * auVar28._12_4_;
            uVar61 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar66._4_4_ = uVar61;
            auVar66._0_4_ = uVar61;
            auVar66._8_4_ = uVar61;
            auVar66._12_4_ = uVar61;
            auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]))
            ;
            auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar61 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar33._4_4_ = uVar61;
            auVar33._0_4_ = uVar61;
            auVar33._8_4_ = uVar61;
            auVar33._12_4_ = uVar61;
            auVar33 = vsubps_avx512vl(auVar34,auVar33);
            local_2468 = vfmsub231ps_fma(auVar38,auVar27,auVar26);
            uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar34._4_4_ = uVar61;
            auVar34._0_4_ = uVar61;
            auVar34._8_4_ = uVar61;
            auVar34._12_4_ = uVar61;
            auVar34 = vsubps_avx512vl(auVar35,auVar34);
            uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar35._4_4_ = uVar61;
            auVar35._0_4_ = uVar61;
            auVar35._8_4_ = uVar61;
            auVar35._12_4_ = uVar61;
            auVar35 = vsubps_avx512vl(auVar36,auVar35);
            auVar36 = vmulps_avx512vl(auVar31,auVar35);
            auVar37 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar32);
            auVar36 = vmulps_avx512vl(auVar32,auVar33);
            auVar38 = vfmsub231ps_avx512vl(auVar36,auVar35,auVar66);
            auVar36 = vmulps_avx512vl(auVar66,auVar34);
            auVar39 = vfmsub231ps_avx512vl(auVar36,auVar33,auVar31);
            auVar36 = vmulps_avx512vl(local_2468,auVar32);
            auVar36 = vfmadd231ps_avx512vl(auVar36,local_2478,auVar31);
            auVar31 = vfmadd231ps_avx512vl(auVar36,local_2488,auVar66);
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            local_24d8 = vandps_avx512vl(auVar31,auVar36);
            auVar40 = vmulps_avx512vl(auVar40,auVar39);
            auVar28 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar28);
            auVar27 = vfmadd231ps_fma(auVar28,auVar37,auVar27);
            auVar40._8_4_ = 0x80000000;
            auVar40._0_8_ = 0x8000000080000000;
            auVar40._12_4_ = 0x80000000;
            auVar28 = vandpd_avx512vl(auVar31,auVar40);
            uVar63 = auVar28._0_4_;
            local_2508._0_4_ = (float)(uVar63 ^ auVar27._0_4_);
            uVar21 = auVar28._4_4_;
            local_2508._4_4_ = (float)(uVar21 ^ auVar27._4_4_);
            uVar64 = auVar28._8_4_;
            local_2508._8_4_ = (float)(uVar64 ^ auVar27._8_4_);
            uVar65 = auVar28._12_4_;
            local_2508._12_4_ = (float)(uVar65 ^ auVar27._12_4_);
            auVar29 = vmulps_avx512vl(auVar29,auVar39);
            auVar26 = vfmadd231ps_avx512vl(auVar29,auVar26,auVar38);
            auVar30 = vfmadd231ps_fma(auVar26,auVar30,auVar37);
            local_24f8._0_4_ = (float)(uVar63 ^ auVar30._0_4_);
            local_24f8._4_4_ = (float)(uVar21 ^ auVar30._4_4_);
            local_24f8._8_4_ = (float)(uVar64 ^ auVar30._8_4_);
            local_24f8._12_4_ = (float)(uVar65 ^ auVar30._12_4_);
            auVar30 = ZEXT816(0) << 0x20;
            uVar11 = vcmpps_avx512vl(local_2508,auVar30,5);
            uVar7 = vcmpps_avx512vl(local_24f8,auVar30,5);
            uVar8 = vcmpps_avx512vl(auVar31,auVar30,4);
            auVar30._0_4_ = local_2508._0_4_ + local_24f8._0_4_;
            auVar30._4_4_ = local_2508._4_4_ + local_24f8._4_4_;
            auVar30._8_4_ = local_2508._8_4_ + local_24f8._8_4_;
            auVar30._12_4_ = local_2508._12_4_ + local_24f8._12_4_;
            uVar9 = vcmpps_avx512vl(auVar30,local_24d8,2);
            local_24c7 = (byte)uVar11 & (byte)uVar7 & (byte)uVar8 & (byte)uVar9;
            if (local_24c7 != 0) {
              auVar62._0_4_ = auVar35._0_4_ * local_2468._0_4_;
              auVar62._4_4_ = auVar35._4_4_ * local_2468._4_4_;
              auVar62._8_4_ = auVar35._8_4_ * local_2468._8_4_;
              auVar62._12_4_ = auVar35._12_4_ * local_2468._12_4_;
              auVar30 = vfmadd213ps_fma(auVar34,local_2478,auVar62);
              auVar30 = vfmadd213ps_fma(auVar33,local_2488,auVar30);
              local_24e8._0_4_ = (float)(uVar63 ^ auVar30._0_4_);
              local_24e8._4_4_ = (float)(uVar21 ^ auVar30._4_4_);
              local_24e8._8_4_ = (float)(uVar64 ^ auVar30._8_4_);
              local_24e8._12_4_ = (float)(uVar65 ^ auVar30._12_4_);
              uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar39._4_4_ = uVar61;
              auVar39._0_4_ = uVar61;
              auVar39._8_4_ = uVar61;
              auVar39._12_4_ = uVar61;
              auVar30 = vmulps_avx512vl(local_24d8,auVar39);
              fVar52 = (ray->super_RayK<1>).tfar;
              auVar13._4_4_ = fVar52;
              auVar13._0_4_ = fVar52;
              auVar13._8_4_ = fVar52;
              auVar13._12_4_ = fVar52;
              auVar26 = vmulps_avx512vl(local_24d8,auVar13);
              uVar11 = vcmpps_avx512vl(local_24e8,auVar26,2);
              uVar7 = vcmpps_avx512vl(auVar30,local_24e8,1);
              local_24c7 = (byte)uVar11 & (byte)uVar7 & local_24c7;
              if (local_24c7 != 0) {
                lVar18 = lVar18 + uVar20;
                auVar3._0_4_ = (ray->super_RayK<1>).tfar;
                auVar3._4_4_ = (ray->super_RayK<1>).mask;
                auVar3._8_4_ = (ray->super_RayK<1>).id;
                auVar3._12_4_ = (ray->super_RayK<1>).flags;
                auVar56 = ZEXT1664(auVar3);
                local_25ec = (uint)local_24c7;
                uVar63 = vextractps_avx(auVar3,1);
                auVar30 = vrcp14ps_avx512vl(local_24d8);
                auVar14._8_4_ = 0x3f800000;
                auVar14._0_8_ = 0x3f8000003f800000;
                auVar14._12_4_ = 0x3f800000;
                auVar26 = vfnmadd213ps_avx512vl(local_24d8,auVar30,auVar14);
                auVar30 = vfmadd132ps_fma(auVar26,auVar30,auVar30);
                fVar52 = auVar30._0_4_;
                local_2498._0_4_ = fVar52 * local_24e8._0_4_;
                fVar58 = auVar30._4_4_;
                local_2498._4_4_ = fVar58 * local_24e8._4_4_;
                fVar59 = auVar30._8_4_;
                local_2498._8_4_ = fVar59 * local_24e8._8_4_;
                fVar60 = auVar30._12_4_;
                local_2498._12_4_ = fVar60 * local_24e8._12_4_;
                auVar55 = ZEXT1664(local_2498);
                local_24b8[0] = fVar52 * local_2508._0_4_;
                local_24b8[1] = fVar58 * local_2508._4_4_;
                local_24b8[2] = fVar59 * local_2508._8_4_;
                local_24b8[3] = fVar60 * local_2508._12_4_;
                local_24a8[0] = fVar52 * local_24f8._0_4_;
                local_24a8[1] = fVar58 * local_24f8._4_4_;
                local_24a8[2] = fVar59 * local_24f8._8_4_;
                local_24a8[3] = fVar60 * local_24f8._12_4_;
                auVar53._8_4_ = 0x7f800000;
                auVar53._0_8_ = 0x7f8000007f800000;
                auVar53._12_4_ = 0x7f800000;
                auVar30 = vblendmps_avx512vl(auVar53,local_2498);
                auVar41._0_4_ =
                     (uint)(local_24c7 & 1) * auVar30._0_4_ |
                     (uint)!(bool)(local_24c7 & 1) * 0x7f800000;
                bVar6 = (bool)(local_24c7 >> 1 & 1);
                auVar41._4_4_ = (uint)bVar6 * auVar30._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24c7 >> 2 & 1);
                auVar41._8_4_ = (uint)bVar6 * auVar30._8_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24c7 >> 3 & 1);
                auVar41._12_4_ = (uint)bVar6 * auVar30._12_4_ | (uint)!bVar6 * 0x7f800000;
                auVar30 = vshufps_avx(auVar41,auVar41,0xb1);
                auVar30 = vminps_avx(auVar30,auVar41);
                auVar26 = vshufpd_avx(auVar30,auVar30,1);
                auVar30 = vminps_avx(auVar26,auVar30);
                uVar11 = vcmpps_avx512vl(auVar41,auVar30,0);
                uVar21 = local_25ec;
                if (((byte)uVar11 & local_24c7) != 0) {
                  uVar21 = (uint)((byte)uVar11 & local_24c7);
                }
                uVar64 = 0;
                for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
                  uVar64 = uVar64 + 1;
                }
                local_2590 = local_25b0->scene;
                do {
                  local_2528 = auVar56._0_16_;
                  local_2518 = auVar55._0_16_;
                  uVar21 = uVar64 & 0xff;
                  local_2540 = *(uint *)(lVar18 + 0x120 + (ulong)uVar21 * 4);
                  local_2598 = (local_2590->geometries).items[local_2540].ptr;
                  if ((local_2598->mask & uVar63) == 0) {
                    bVar16 = ~(byte)(1 << (uVar64 & 0x1f)) & (byte)local_25ec;
                  }
                  else {
                    pRVar5 = local_25b0->args;
                    local_2458 = auVar74._0_32_;
                    local_2438 = auVar73._0_32_;
                    local_2418 = auVar72._0_32_;
                    local_23f8 = auVar71._0_32_;
                    local_23d8 = auVar69._0_32_;
                    local_23b8 = auVar68._0_32_;
                    local_2398 = auVar67._0_32_;
                    if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
                      local_2588.context = local_25b0->user;
                      if (local_2598->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar25 = (ulong)(uVar21 << 2);
                        fVar52 = *(float *)((long)local_24b8 + uVar25);
                        fVar58 = *(float *)((long)local_24a8 + uVar25);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar25);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar25);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar25);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar25);
                        ray->u = fVar52;
                        ray->v = fVar58;
                        ray->primID = *(uint *)(lVar18 + 0x130 + uVar25);
                        ray->geomID = local_2540;
                        ray->instID[0] = (local_2588.context)->instID[0];
                        ray->instPrimID[0] = (local_2588.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_2588.context = local_25b0->user;
                    }
                    uVar25 = (ulong)(uVar21 * 4);
                    local_2558 = *(float *)(local_2488 + uVar25);
                    local_2554 = *(undefined4 *)(local_2478 + uVar25);
                    local_2550 = *(undefined4 *)(local_2468 + uVar25);
                    local_254c = *(undefined4 *)((long)local_24b8 + uVar25);
                    local_2548 = *(undefined4 *)((long)local_24a8 + uVar25);
                    local_2544 = *(undefined4 *)(lVar18 + 0x130 + uVar25);
                    local_253c = (local_2588.context)->instID[0];
                    local_2538 = (local_2588.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar25);
                    local_25c4 = -1;
                    local_2588.valid = &local_25c4;
                    local_2588.geometryUserPtr = local_2598->userPtr;
                    local_2588.ray = (RTCRayN *)ray;
                    local_2588.hit = (RTCHitN *)&local_2558;
                    local_2588.N = 1;
                    if (((local_2598->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_2598->intersectionFilterN)(&local_2588), *local_2588.valid != 0))
                       && ((pRVar5->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_2598->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar5->filter)(&local_2588), *local_2588.valid != 0)))))) {
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2588.hit;
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2588.hit + 4);
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2588.hit + 8);
                      *(float *)((long)local_2588.ray + 0x3c) = *(float *)(local_2588.hit + 0xc);
                      *(float *)((long)local_2588.ray + 0x40) = *(float *)(local_2588.hit + 0x10);
                      *(float *)((long)local_2588.ray + 0x44) = *(float *)(local_2588.hit + 0x14);
                      *(float *)((long)local_2588.ray + 0x48) = *(float *)(local_2588.hit + 0x18);
                      *(float *)((long)local_2588.ray + 0x4c) = *(float *)(local_2588.hit + 0x1c);
                      *(float *)((long)local_2588.ray + 0x50) = *(float *)(local_2588.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_2528._0_4_;
                    }
                    auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar4._4_4_ = (ray->super_RayK<1>).mask;
                    auVar4._8_4_ = (ray->super_RayK<1>).id;
                    auVar4._12_4_ = (ray->super_RayK<1>).flags;
                    auVar56 = ZEXT1664(auVar4);
                    auVar55 = ZEXT1664(local_2518);
                    fVar52 = (ray->super_RayK<1>).tfar;
                    auVar15._4_4_ = fVar52;
                    auVar15._0_4_ = fVar52;
                    auVar15._8_4_ = fVar52;
                    auVar15._12_4_ = fVar52;
                    uVar11 = vcmpps_avx512vl(local_2518,auVar15,2);
                    bVar16 = ~(byte)(1 << (uVar64 & 0x1f)) & (byte)local_25ec & (byte)uVar11;
                    uVar63 = vextractps_avx(auVar4,1);
                    auVar67 = ZEXT3264(local_2398);
                    auVar68 = ZEXT3264(local_23b8);
                    auVar69 = ZEXT3264(local_23d8);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar70 = ZEXT3264(auVar43);
                    auVar71 = ZEXT3264(local_23f8);
                    auVar72 = ZEXT3264(local_2418);
                    auVar73 = ZEXT3264(local_2438);
                    auVar74 = ZEXT3264(local_2458);
                    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar75 = ZEXT3264(auVar43);
                    auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar76 = ZEXT3264(auVar43);
                    auVar30 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar77 = ZEXT1664(auVar30);
                    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar78 = ZEXT3264(auVar43);
                  }
                  local_25ec = (uint)bVar16;
                  if (bVar16 == 0) break;
                  auVar54._8_4_ = 0x7f800000;
                  auVar54._0_8_ = 0x7f8000007f800000;
                  auVar54._12_4_ = 0x7f800000;
                  auVar30 = vblendmps_avx512vl(auVar54,auVar55._0_16_);
                  auVar42._0_4_ =
                       (uint)(bVar16 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar16 & 1) * 0x7f800000;
                  bVar6 = (bool)(bVar16 >> 1 & 1);
                  auVar42._4_4_ = (uint)bVar6 * auVar30._4_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)(bVar16 >> 2 & 1);
                  auVar42._8_4_ = (uint)bVar6 * auVar30._8_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)(bVar16 >> 3 & 1);
                  auVar42._12_4_ = (uint)bVar6 * auVar30._12_4_ | (uint)!bVar6 * 0x7f800000;
                  auVar30 = vshufps_avx(auVar42,auVar42,0xb1);
                  auVar30 = vminps_avx(auVar30,auVar42);
                  auVar26 = vshufpd_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar26,auVar30);
                  uVar11 = vcmpps_avx512vl(auVar42,auVar30,0);
                  bVar16 = (byte)uVar11 & bVar16;
                  uVar21 = local_25ec;
                  if (bVar16 != 0) {
                    uVar21 = (uint)bVar16;
                  }
                  uVar64 = 0;
                  for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
                    uVar64 = uVar64 + 1;
                  }
                } while( true );
              }
            }
            local_25a8 = local_25a8 + 1;
          } while (local_25a8 != local_25a0);
        }
        fVar52 = (ray->super_RayK<1>).tfar;
        auVar55 = ZEXT3264(CONCAT428(fVar52,CONCAT424(fVar52,CONCAT420(fVar52,CONCAT416(fVar52,
                                                  CONCAT412(fVar52,CONCAT48(fVar52,CONCAT44(fVar52,
                                                  fVar52))))))));
        auVar56 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
LAB_01f1e1dd:
    } while (local_25b8 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }